

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::DeCompressFromEncodedURIComponent
          (wstring *__return_storage_ptr__,LZString *this,string *input)

{
  int length;
  ulong uVar1;
  anon_class_16_2_f7f498b7 local_50;
  GetNextCharFunc local_40;
  string *local_20;
  string *input_local;
  LZString *this_local;
  
  local_20 = input;
  input_local = (string *)this;
  this_local = (LZString *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    length = std::__cxx11::string::size();
    local_50.input = local_20;
    local_50.this = this;
    std::function<wchar_t(int)>::
    function<lzstring::LZString::DeCompressFromEncodedURIComponent(std::__cxx11::string_const&)::__0,void>
              ((function<wchar_t(int)> *)&local_40,&local_50);
    DeCompress_abi_cxx11_(__return_storage_ptr__,this,length,0x20,&local_40);
    std::function<wchar_t_(int)>::~function(&local_40);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromEncodedURIComponent(const std::string &input)
{
	if (input.empty())
		return std::wstring();

	return DeCompress(input.size(), 32, [this, &input](int index) { return (wchar_t)m_keyStrUrisafeDict[input[index]]; });
}